

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_create(REF_MIGRATE *ref_migrate_ptr,REF_GRID ref_grid)

{
  size_t __size;
  REF_INT reference;
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL pRVar2;
  bool bVar3;
  uint uVar4;
  REF_MIGRATE pRVar5;
  REF_GLOB *__s;
  REF_DBL *pRVar6;
  REF_INT *pRVar7;
  int iVar8;
  undefined8 uVar9;
  REF_INT RVar10;
  ulong uVar11;
  long lVar12;
  REF_STATUS RVar13;
  long lVar14;
  char *pcVar15;
  REF_ADJ *ref_adj_ptr;
  long lVar16;
  REF_CELL *ppRVar17;
  
  ref_node = ref_grid->node;
  pRVar5 = (REF_MIGRATE)malloc(0x48);
  *ref_migrate_ptr = pRVar5;
  if (pRVar5 == (REF_MIGRATE)0x0) {
    pcVar15 = "malloc *ref_migrate_ptr of REF_MIGRATE_STRUCT NULL";
    uVar9 = 0x43;
  }
  else {
    pRVar5->grid = ref_grid;
    uVar4 = ref_adj_create(&pRVar5->parent_local);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x49,"ref_migrate_create",(ulong)uVar4,"make adj");
      return uVar4;
    }
    uVar4 = ref_adj_create(&pRVar5->parent_part);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x4a,"ref_migrate_create",(ulong)uVar4,"make adj");
      return uVar4;
    }
    ref_adj_ptr = &pRVar5->conn;
    uVar4 = ref_adj_create(ref_adj_ptr);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x4b,"ref_migrate_create",(ulong)uVar4,"make adj");
      return uVar4;
    }
    iVar8 = ref_node->max;
    pRVar5->max = iVar8;
    if ((long)iVar8 < 0) {
      bVar3 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x50,"ref_migrate_create","malloc ref_migrate->global of REF_GLOB negative");
      RVar13 = 1;
    }
    else {
      __size = (long)iVar8 * 8;
      __s = (REF_GLOB *)malloc(__size);
      pRVar5->global = __s;
      if (__s == (REF_GLOB *)0x0) {
        bVar3 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x50,"ref_migrate_create","malloc ref_migrate->global of REF_GLOB NULL");
        RVar13 = 2;
      }
      else {
        if (iVar8 != 0) {
          memset(__s,0xff,__size);
        }
        bVar3 = true;
        RVar13 = 0;
      }
    }
    if (!bVar3) {
      return RVar13;
    }
    uVar11 = (ulong)(uint)pRVar5->max;
    if (pRVar5->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x51,"ref_migrate_create","malloc ref_migrate->xyz of REF_DBL negative");
      return 1;
    }
    pRVar6 = (REF_DBL *)malloc(uVar11 * 0x18);
    pRVar5->xyz = pRVar6;
    if (pRVar6 == (REF_DBL *)0x0) {
      pcVar15 = "malloc ref_migrate->xyz of REF_DBL NULL";
      uVar9 = 0x51;
    }
    else {
      pRVar6 = (REF_DBL *)malloc(uVar11 * 8);
      pRVar5->weight = pRVar6;
      if (pRVar6 == (REF_DBL *)0x0) {
        pcVar15 = "malloc ref_migrate->weight of REF_DBL NULL";
        uVar9 = 0x52;
      }
      else {
        pRVar7 = (REF_INT *)malloc(uVar11 << 2);
        pRVar5->age = pRVar7;
        if (pRVar7 != (REF_INT *)0x0) {
          if (0 < ref_node->max) {
            lVar14 = 2;
            lVar16 = 2;
            lVar12 = 0;
            do {
              if ((-1 < ref_node->global[lVar12]) &&
                 (ref_node->ref_mpi->id == ref_node->part[lVar12])) {
                pRVar5->global[lVar12] = ref_node->global[lVar12];
                RVar10 = (REF_INT)lVar12;
                uVar4 = ref_adj_add(pRVar5->parent_local,RVar10,RVar10);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x59,"ref_migrate_create",(ulong)uVar4,"add");
                  return uVar4;
                }
                uVar4 = ref_adj_add(pRVar5->parent_part,RVar10,ref_node->part[lVar12]);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x5c,"ref_migrate_create",(ulong)uVar4,"add");
                  return uVar4;
                }
                pRVar6 = ref_node->real;
                pRVar1 = pRVar5->xyz;
                pRVar1[lVar16 + -2] = pRVar6[lVar14 + -2];
                pRVar1[lVar16 + -1] = pRVar6[lVar14 + -1];
                pRVar1[lVar16] = pRVar6[lVar14];
                pRVar5->weight[lVar12] = 1.0;
                pRVar5->age[lVar12] = ref_node->age[lVar12];
              }
              lVar12 = lVar12 + 1;
              lVar16 = lVar16 + 3;
              lVar14 = lVar14 + 0xf;
            } while (lVar12 < ref_node->max);
          }
          uVar4 = ref_node_ghost_int(ref_node,pRVar5->age,1);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x65,"ref_migrate_create",(ulong)uVar4,"ghost age for edge weights");
            return uVar4;
          }
          ppRVar17 = ref_grid->cell + 3;
          lVar12 = 3;
          do {
            pRVar2 = *ppRVar17;
            if (0 < pRVar2->max) {
              iVar8 = 0;
              do {
                if ((pRVar2->c2n[(long)pRVar2->size_per * (long)iVar8] != -1) &&
                   (0 < pRVar2->edge_per)) {
                  lVar14 = 0;
                  do {
                    lVar16 = (long)pRVar2->size_per * (long)iVar8;
                    RVar10 = pRVar2->c2n[pRVar2->e2n[lVar14 * 2] + lVar16];
                    reference = pRVar2->c2n[(long)(int)lVar16 + (long)pRVar2->e2n[lVar14 * 2 + 1]];
                    uVar4 = ref_adj_add_uniquely(*ref_adj_ptr,RVar10,reference);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x6f,"ref_migrate_create",(ulong)uVar4,"uniq");
                      return uVar4;
                    }
                    uVar4 = ref_adj_add_uniquely(*ref_adj_ptr,reference,RVar10);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x71,"ref_migrate_create",(ulong)uVar4,"uniq");
                      return uVar4;
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < pRVar2->edge_per);
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < pRVar2->max);
            }
            ppRVar17 = ref_grid->cell + lVar12 + 1;
            lVar12 = lVar12 + 1;
            if (lVar12 == 0x10) {
              return 0;
            }
          } while( true );
        }
        pcVar15 = "malloc ref_migrate->age of REF_INT NULL";
        uVar9 = 0x53;
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar9,
         "ref_migrate_create",pcVar15);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_create(REF_MIGRATE *ref_migrate_ptr,
                                      REF_GRID ref_grid) {
  REF_MIGRATE ref_migrate;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT group, cell, cell_edge, n0, n1;

  ref_malloc(*ref_migrate_ptr, 1, REF_MIGRATE_STRUCT);

  ref_migrate = *ref_migrate_ptr;

  ref_migrate_grid(ref_migrate) = ref_grid;

  RSS(ref_adj_create(&(ref_migrate_parent_local(ref_migrate))), "make adj");
  RSS(ref_adj_create(&(ref_migrate_parent_part(ref_migrate))), "make adj");
  RSS(ref_adj_create(&(ref_migrate_conn(ref_migrate))), "make adj");

  ref_migrate_max(ref_migrate) = ref_node_max(ref_node);

  ref_malloc_init(ref_migrate->global, ref_migrate_max(ref_migrate), REF_GLOB,
                  REF_EMPTY);
  ref_malloc(ref_migrate->xyz, 3 * ref_migrate_max(ref_migrate), REF_DBL);
  ref_malloc(ref_migrate->weight, ref_migrate_max(ref_migrate), REF_DBL);
  ref_malloc(ref_migrate->age, ref_migrate_max(ref_migrate), REF_INT);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      ref_migrate_global(ref_migrate, node) = ref_node_global(ref_node, node);
      RSS(ref_adj_add(ref_migrate_parent_local(ref_migrate), node, node),
          "add");
      RSS(ref_adj_add(ref_migrate_parent_part(ref_migrate), node,
                      ref_node_part(ref_node, node)),
          "add");
      ref_migrate_xyz(ref_migrate, 0, node) = ref_node_xyz(ref_node, 0, node);
      ref_migrate_xyz(ref_migrate, 1, node) = ref_node_xyz(ref_node, 1, node);
      ref_migrate_xyz(ref_migrate, 2, node) = ref_node_xyz(ref_node, 2, node);
      ref_migrate_weight(ref_migrate, node) = 1.0;
      ref_migrate_age(ref_migrate, node) = ref_node_age(ref_node, node);
    }
  }
  RSS(ref_node_ghost_int(ref_node, (ref_migrate->age), 1),
      "ghost age for edge weights");

  /* 2d included for twod */
  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        /* need ghost nodes for agglomeration */
        n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
        n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
        RSS(ref_adj_add_uniquely(ref_migrate_conn(ref_migrate), n0, n1),
            "uniq");
        RSS(ref_adj_add_uniquely(ref_migrate_conn(ref_migrate), n1, n0),
            "uniq");
      }
    }
  }

  return REF_SUCCESS;
}